

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ban.c
# Opt level: O2

bool check_ban(char *usite,int type,int host)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  CRow *pCVar5;
  char cVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  CRow row;
  string buffer;
  char *local_1238 [2];
  char site [4608];
  
  pcVar4 = capitalize(usite);
  strcpy(site,pcVar4);
  cVar1 = (char)site._0_4_;
  cVar6 = cVar1 + ' ';
  if (0x19 < (byte)(cVar1 + 0xbfU)) {
    cVar6 = cVar1;
  }
  site[0] = cVar6;
  bVar2 = false;
  iVar3 = CSQLInterface::Select
                    (&RS.SQL,"site,duration FROM bans WHERE ban_type=%d AND host_type=%d",
                     (ulong)(uint)type,(ulong)(uint)host);
  if (iVar3 != 0) {
    do {
      bVar2 = CSQLInterface::End(&RS.SQL);
      if (bVar2) {
        return false;
      }
      pCVar5 = CSQLInterface::GetRow(&RS.SQL);
      row.maxcol = pCVar5->maxcol;
      row.maxrow = pCVar5->maxrow;
      row.rowpos = pCVar5->rowpos;
      row.row = pCVar5->row;
      pcVar4 = CRow::operator[](&row,0);
      pcVar4 = strstr(site,pcVar4);
    } while (pcVar4 == (char *)0x0);
    fmt.size_ = 0xc;
    fmt.data_ = (char *)0x22;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1238;
    local_1238[0] = site;
    ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)"BANNED - {} just tried to connect.",fmt,args);
    wiznet(buffer._M_dataplus._M_p,(CHAR_DATA *)0x0,(OBJ_DATA *)0x0,2,0,0);
    std::__cxx11::string::~string((string *)&buffer);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool check_ban(char *usite, int type, int host)
{
	char site[MSL];

	strcpy(site, capitalize(usite));
	site[0] = LOWER(site[0]);

	auto res = RS.SQL.Select("site,duration FROM bans WHERE ban_type=%d AND host_type=%d", type, host);
	if (res)
	{
		while (!RS.SQL.End())
		{
			auto row = RS.SQL.GetRow();
			if (strstr(site, row[0]) != nullptr)
			{
				auto buffer = fmt::format("BANNED - {} just tried to connect.", site); //TODO: change the rest of the sprintf calls to format
				wiznet(buffer.data(), nullptr, nullptr, WIZ_LOGINS, 0, 0);
				return true;
			}
		}
	}

	return false;
}